

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O1

void __thiscall QInputDialogPrivate::plainTextEditTextChanged(QInputDialogPrivate *this)

{
  QObject *pQVar1;
  undefined1 *puVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  QArrayData *local_58;
  storage_type_conflict *psStack_50;
  undefined1 *local_48;
  void *local_38;
  undefined1 *puStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  psStack_50 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  QPlainTextEdit::document(this->plainTextEdit);
  QTextDocument::toPlainText();
  puVar2 = (undefined1 *)(this->textValue).d.size;
  if (puVar2 == local_48) {
    QVar4.m_data = (this->textValue).d.ptr;
    QVar4.m_size = (qsizetype)puVar2;
    QVar5.m_data = psStack_50;
    QVar5.m_size = (qsizetype)local_48;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') goto LAB_005074b7;
  }
  QString::operator=(&this->textValue,(QString *)&local_58);
  local_38 = (void *)0x0;
  puStack_30 = (undefined1 *)&local_58;
  QMetaObject::activate(pQVar1,&QInputDialog::staticMetaObject,0,&local_38);
LAB_005074b7:
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::plainTextEditTextChanged()
{
    Q_Q(QInputDialog);
    QString text = plainTextEdit->toPlainText();
    if (textValue != text) {
        textValue = text;
        emit q->textValueChanged(text);
    }
}